

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O3

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericRegex
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,Ch *source,
          CrtAllocator *allocator)

{
  bool bVar1;
  CrtAllocator *pCVar2;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_> ds;
  GenericStringStream<rapidjson::UTF8<char>_> ss;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
  local_40;
  GenericStringStream<rapidjson::UTF8<char>_> local_30;
  
  if (allocator == (CrtAllocator *)0x0) {
    pCVar2 = (CrtAllocator *)operator_new(1);
    allocator = pCVar2;
  }
  else {
    pCVar2 = (CrtAllocator *)0x0;
  }
  this->ownAllocator_ = pCVar2;
  this->allocator_ = allocator;
  (this->states_).allocator_ = allocator;
  (this->states_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->states_).stack_ = (char *)0x0;
  (this->states_).stackTop_ = (char *)0x0;
  (this->states_).stackEnd_ = (char *)0x0;
  (this->states_).initialCapacity_ = 0x100;
  (this->ranges_).allocator_ = allocator;
  (this->ranges_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->ranges_).stack_ = (char *)0x0;
  (this->ranges_).stackTop_ = (char *)0x0;
  (this->ranges_).stackEnd_ = (char *)0x0;
  (this->ranges_).initialCapacity_ = 0x100;
  this->root_ = 0xffffffff;
  this->stateCount_ = 0;
  this->rangeCount_ = 0;
  this->anchorBegin_ = false;
  this->anchorEnd_ = false;
  local_40.ss_ = &local_30;
  local_40.codepoint_ = 0;
  local_30.src_ = source;
  local_30.head_ = source;
  bVar1 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                    (local_40.ss_,&local_40.codepoint_);
  if (!bVar1) {
    local_40.codepoint_ = 0;
  }
  GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
  Parse<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
            ((GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)this,&local_40);
  return;
}

Assistant:

GenericRegex(const Ch* source, Allocator* allocator = 0) : 
        ownAllocator_(allocator ? 0 : RAPIDJSON_NEW(Allocator)()), allocator_(allocator ? allocator : ownAllocator_), 
        states_(allocator_, 256), ranges_(allocator_, 256), root_(kRegexInvalidState), stateCount_(), rangeCount_(), 
        anchorBegin_(), anchorEnd_()
    {
        GenericStringStream<Encoding> ss(source);
        DecodedStream<GenericStringStream<Encoding>, Encoding> ds(ss);
        Parse(ds);
    }